

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugXML.c
# Opt level: O1

void xmlCtxtDumpDocHead(xmlDebugCtxtPtr ctxt,xmlDocPtr doc)

{
  xmlElementType xVar1;
  FILE *pFVar2;
  undefined8 uVar3;
  size_t __size;
  char *pcVar4;
  
  ctxt->node = (xmlNodePtr)doc;
  xVar1 = doc->type;
  switch(xVar1) {
  case XML_ELEMENT_NODE:
    ctxt->errors = ctxt->errors + 1;
    pFVar2 = (FILE *)ctxt->output;
    pcVar4 = "Misplaced ELEMENT node\n";
    uVar3 = 5000;
    break;
  case XML_ATTRIBUTE_NODE:
    ctxt->errors = ctxt->errors + 1;
    pFVar2 = (FILE *)ctxt->output;
    pcVar4 = "Misplaced ATTRIBUTE node\n";
    uVar3 = 0x1389;
    break;
  case XML_TEXT_NODE:
    ctxt->errors = ctxt->errors + 1;
    pFVar2 = (FILE *)ctxt->output;
    pcVar4 = "Misplaced TEXT node\n";
    uVar3 = 0x138a;
    break;
  case XML_CDATA_SECTION_NODE:
    ctxt->errors = ctxt->errors + 1;
    pFVar2 = (FILE *)ctxt->output;
    pcVar4 = "Misplaced CDATA node\n";
    uVar3 = 0x138b;
    break;
  case XML_ENTITY_REF_NODE:
    ctxt->errors = ctxt->errors + 1;
    pFVar2 = (FILE *)ctxt->output;
    pcVar4 = "Misplaced ENTITYREF node\n";
    uVar3 = 0x138c;
    break;
  case XML_ENTITY_NODE:
    ctxt->errors = ctxt->errors + 1;
    pFVar2 = (FILE *)ctxt->output;
    pcVar4 = "Misplaced ENTITY node\n";
    uVar3 = 0x138d;
    break;
  case XML_PI_NODE:
    ctxt->errors = ctxt->errors + 1;
    pFVar2 = (FILE *)ctxt->output;
    pcVar4 = "Misplaced PI node\n";
    uVar3 = 0x138e;
    break;
  case XML_COMMENT_NODE:
    ctxt->errors = ctxt->errors + 1;
    pFVar2 = (FILE *)ctxt->output;
    pcVar4 = "Misplaced COMMENT node\n";
    uVar3 = 0x138f;
    break;
  case XML_DOCUMENT_NODE:
    if (ctxt->check != 0) {
      return;
    }
    pFVar2 = (FILE *)ctxt->output;
    pcVar4 = "DOCUMENT\n";
    __size = 9;
    goto LAB_00168d66;
  case XML_DOCUMENT_TYPE_NODE:
    ctxt->errors = ctxt->errors + 1;
    pFVar2 = (FILE *)ctxt->output;
    pcVar4 = "Misplaced DOCTYPE node\n";
    uVar3 = 0x1390;
    break;
  case XML_DOCUMENT_FRAG_NODE:
    ctxt->errors = ctxt->errors + 1;
    pFVar2 = (FILE *)ctxt->output;
    pcVar4 = "Misplaced FRAGMENT node\n";
    uVar3 = 0x1391;
    break;
  case XML_NOTATION_NODE:
    ctxt->errors = ctxt->errors + 1;
    pFVar2 = (FILE *)ctxt->output;
    pcVar4 = "Misplaced NOTATION node\n";
    uVar3 = 0x1392;
    break;
  case XML_HTML_DOCUMENT_NODE:
    if (ctxt->check != 0) {
      return;
    }
    pFVar2 = (FILE *)ctxt->output;
    pcVar4 = "HTML DOCUMENT\n";
    __size = 0xe;
LAB_00168d66:
    fwrite(pcVar4,__size,1,pFVar2);
    return;
  default:
    ctxt->errors = ctxt->errors + 1;
    fprintf((FILE *)ctxt->output,"ERROR %d: ",0x1393);
    fprintf((FILE *)ctxt->output,"Unknown node type %d\n",(ulong)xVar1);
    return;
  }
  fprintf(pFVar2,"ERROR %d: %s",uVar3,pcVar4);
  return;
}

Assistant:

static void
xmlCtxtDumpDocHead(xmlDebugCtxtPtr ctxt, xmlDocPtr doc)
{
    if (doc == NULL) {
        if (!ctxt->check)
            fprintf(ctxt->output, "DOCUMENT == NULL !\n");
        return;
    }
    ctxt->node = (xmlNodePtr) doc;

    switch (doc->type) {
        case XML_ELEMENT_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_ELEMENT,
	                "Misplaced ELEMENT node\n");
            break;
        case XML_ATTRIBUTE_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_ATTRIBUTE,
	                "Misplaced ATTRIBUTE node\n");
            break;
        case XML_TEXT_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_TEXT,
	                "Misplaced TEXT node\n");
            break;
        case XML_CDATA_SECTION_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_CDATA,
	                "Misplaced CDATA node\n");
            break;
        case XML_ENTITY_REF_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_ENTITYREF,
	                "Misplaced ENTITYREF node\n");
            break;
        case XML_ENTITY_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_ENTITY,
	                "Misplaced ENTITY node\n");
            break;
        case XML_PI_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_PI,
	                "Misplaced PI node\n");
            break;
        case XML_COMMENT_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_COMMENT,
	                "Misplaced COMMENT node\n");
            break;
        case XML_DOCUMENT_NODE:
	    if (!ctxt->check)
		fprintf(ctxt->output, "DOCUMENT\n");
            break;
        case XML_HTML_DOCUMENT_NODE:
	    if (!ctxt->check)
		fprintf(ctxt->output, "HTML DOCUMENT\n");
            break;
        case XML_DOCUMENT_TYPE_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_DOCTYPE,
	                "Misplaced DOCTYPE node\n");
            break;
        case XML_DOCUMENT_FRAG_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_FRAGMENT,
	                "Misplaced FRAGMENT node\n");
            break;
        case XML_NOTATION_NODE:
	    xmlDebugErr(ctxt, XML_CHECK_FOUND_NOTATION,
	                "Misplaced NOTATION node\n");
            break;
        default:
	    xmlDebugErr2(ctxt, XML_CHECK_UNKNOWN_NODE,
	                "Unknown node type %d\n", doc->type);
    }
}